

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O2

void mouseScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  ImGuiIO *pIVar1;
  float_t fVar2;
  float fVar3;
  mat3 axis;
  vec3 local_48 [2];
  float local_30;
  
  pIVar1 = ImGui::GetIO();
  ImGui_ImplGlfw_ScrollCallback(window,xoffset,yoffset);
  if (pIVar1->WantCaptureMouse == false) {
    dja::transpose(&g_camera.axis);
    fVar3 = (float)yoffset;
    fVar2 = dja::norm(&g_camera.pos);
    local_48[0].z = local_30 * fVar3 * 0.05 * fVar2;
    local_48[0].x = fVar2 * fVar3 * (float)local_48[1]._4_8_ * 0.05;
    local_48[0].y = fVar2 * fVar3 * SUB84(local_48[1]._4_8_,4) * 0.05;
    dja::operator-=(&g_camera.pos,local_48);
  }
  return;
}

Assistant:

void mouseScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_ScrollCallback(window, xoffset, yoffset);
    if (io.WantCaptureMouse)
        return;

    dja::mat3 axis = dja::transpose(g_camera.axis);
    g_camera.pos -= axis[0] * yoffset * 5e-2 * norm(g_camera.pos);
}